

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

void * ncnn::fastMalloc(size_t size)

{
  uchar *puVar1;
  long in_RDI;
  uchar **adata;
  uchar *udata;
  uchar **local_8;
  
  puVar1 = (uchar *)malloc(in_RDI + 0x18);
  if (puVar1 == (uchar *)0x0) {
    local_8 = (uchar **)0x0;
  }
  else {
    local_8 = alignPtr<unsigned_char*>((uchar **)(puVar1 + 8),0x10);
    local_8[-1] = puVar1;
  }
  return local_8;
}

Assistant:

static inline void* fastMalloc(size_t size)
{
    unsigned char* udata = (unsigned char*)malloc(size + sizeof(void*) + MALLOC_ALIGN);
    if (!udata)
        return 0;
    unsigned char** adata = alignPtr((unsigned char**)udata + 1, MALLOC_ALIGN);
    adata[-1] = udata;
    return adata;
}